

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_growth_policy.h
# Opt level: O0

void __thiscall
tsl::rh::prime_growth_policy::prime_growth_policy
          (prime_growth_policy *this,size_t *min_bucket_count_in_out)

{
  const_iterator pvVar1;
  const_iterator __last;
  unsigned_long *__last_00;
  difference_type dVar2;
  unsigned_long *it_prime;
  size_t *min_bucket_count_in_out_local;
  prime_growth_policy *this_local;
  
  pvVar1 = std::array<unsigned_long,_51UL>::begin((array<unsigned_long,_51UL> *)detail::PRIMES);
  __last = std::array<unsigned_long,_51UL>::end((array<unsigned_long,_51UL> *)detail::PRIMES);
  __last_00 = std::lower_bound<unsigned_long_const*,unsigned_long>
                        (pvVar1,__last,min_bucket_count_in_out);
  pvVar1 = std::array<unsigned_long,_51UL>::end((array<unsigned_long,_51UL> *)detail::PRIMES);
  if (__last_00 == pvVar1) {
    std::terminate();
  }
  pvVar1 = std::array<unsigned_long,_51UL>::begin((array<unsigned_long,_51UL> *)detail::PRIMES);
  dVar2 = std::distance<unsigned_long_const*>(pvVar1,__last_00);
  this->m_iprime = (uint)dVar2;
  if (*min_bucket_count_in_out == 0) {
    *min_bucket_count_in_out = 0;
  }
  else {
    *min_bucket_count_in_out = *__last_00;
  }
  return;
}

Assistant:

explicit prime_growth_policy(std::size_t& min_bucket_count_in_out) {
    auto it_prime = std::lower_bound(
        detail::PRIMES.begin(), detail::PRIMES.end(), min_bucket_count_in_out);
    if (it_prime == detail::PRIMES.end()) {
      TSL_RH_THROW_OR_TERMINATE(std::length_error,
                                "The hash table exceeds its maximum size.");
    }

    m_iprime = static_cast<unsigned int>(
        std::distance(detail::PRIMES.begin(), it_prime));
    if (min_bucket_count_in_out > 0) {
      min_bucket_count_in_out = *it_prime;
    } else {
      min_bucket_count_in_out = 0;
    }
  }